

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.c
# Opt level: O1

int gdImageGetTrueColorPixel(gdImagePtr im,int x,int y)

{
  int iVar1;
  int iVar2;
  
  iVar1 = gdImageGetPixel(im,x,y);
  if (im->trueColor == 0) {
    iVar2 = 0x7f000000;
    if (im->transparent != iVar1) {
      iVar2 = im->alpha[iVar1] << 0x18;
    }
    iVar1 = im->green[iVar1] * 0x100 + im->red[iVar1] * 0x10000 + iVar2 + im->blue[iVar1];
  }
  return iVar1;
}

Assistant:

BGD_DECLARE(int) gdImageGetTrueColorPixel (gdImagePtr im, int x, int y)
{
	int p = gdImageGetPixel (im, x, y);
	if (!im->trueColor) {
		return gdTrueColorAlpha (im->red[p], im->green[p], im->blue[p],
		                         (im->transparent == p) ? gdAlphaTransparent :
		                         im->alpha[p]);
	} else {
		return p;
	}
}